

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInteract.c
# Opt level: O0

void ddSuppInteract(DdNode *f,int *support)

{
  int *support_local;
  DdNode *f_local;
  
  if ((f->index != 0x7fffffff) && (((ulong)(f->type).kids.T & 1) == 0)) {
    support[f->index] = 1;
    ddSuppInteract((f->type).kids.T,support);
    ddSuppInteract((DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe),support);
    (f->type).kids.T = (DdNode *)((ulong)(f->type).kids.T | 1);
    f->next = (DdNode *)((ulong)f->next | 1);
  }
  return;
}

Assistant:

static void
ddSuppInteract(
  DdNode * f,
  int * support)
{
    if (cuddIsConstant(f) || Cudd_IsComplement(cuddT(f))) {
        return;
    }

    support[f->index] = 1;
    ddSuppInteract(cuddT(f),support);
    ddSuppInteract(Cudd_Regular(cuddE(f)),support);
    /* mark as visited */
    cuddT(f) = Cudd_Complement(cuddT(f));
    f->next = Cudd_Complement(f->next);
    return;

}